

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

span<const_slang::ast::Expression_*const,_18446744073709551615UL>
slang::ast::bindMatchItems
          (SequenceMatchListSyntax *syntax,ASTContext *context,AssertionExpr *sequence)

{
  ExpressionKind EVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  PropertyExprSyntax *initialExpr;
  ExpressionSyntax *pEVar5;
  undefined4 extraout_var;
  CallExpression *call;
  UnaryExpression *pUVar6;
  AssignmentExpression *pAVar7;
  AssertionExpr *this_00;
  Diagnostic *this_01;
  Compilation *dst;
  pointer ppEVar8;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  size_type sVar9;
  SourceRange SVar10;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar11;
  anon_class_8_1_bc11688f checkLocalVar;
  Expression *local_c0;
  const_iterator __begin2;
  ASTContext ctx;
  SmallVector<const_slang::ast::Expression_*,_5UL> results;
  Expression *this;
  undefined4 extraout_var_00;
  
  ctx.scope.ptr = (context->scope).ptr;
  ctx.lookupIndex = context->lookupIndex;
  ctx._12_4_ = *(undefined4 *)&context->field_0xc;
  uVar2 = (context->flags).m_bits;
  ctx.instanceOrProc = context->instanceOrProc;
  ctx.firstTempVar = context->firstTempVar;
  ctx.randomizeDetails = context->randomizeDetails;
  ctx.assertionInstance = context->assertionInstance;
  ctx.flags.m_bits = uVar2 & 0xfffffffbf;
  checkLocalVar.context = context;
  if (((uint)uVar2 >> 0x14 & 1) == 0) {
    results.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
         (pointer)results.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
    results.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
    __begin2.index = 0;
    results.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
    sVar9 = (syntax->items).elements.size_;
    __begin2.list = &syntax->items;
    for (; (__begin2.list != &syntax->items || (__begin2.index != sVar9 + 1 >> 1));
        __begin2.index = __begin2.index + 1) {
      initialExpr = slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::
                    iterator_base<const_slang::syntax::PropertyExprSyntax_*>::operator*(&__begin2);
      pEVar5 = ASTContext::requireSimpleExpr(context,initialExpr,(DiagCode)0x200008);
      if (pEVar5 != (ExpressionSyntax *)0x0) {
        iVar4 = Expression::bind((int)pEVar5,(sockaddr *)&ctx,0x20);
        this = (Expression *)CONCAT44(extraout_var,iVar4);
        local_c0 = this;
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)&results,&local_c0);
        EVar1 = this->kind;
        if (EVar1 != Invalid) {
          if (EVar1 == UnaryOp) {
            pUVar6 = Expression::as<slang::ast::UnaryExpression>(this);
            if (pUVar6->op - Preincrement < 4) {
              bindMatchItems::anon_class_8_1_bc11688f::operator()(&checkLocalVar,pUVar6->operand_);
            }
            else {
              ASTContext::addDiag(context,(DiagCode)0x200008,this->sourceRange);
            }
          }
          else if (EVar1 == Assignment) {
            pAVar7 = Expression::as<slang::ast::AssignmentExpression>(this);
            bindMatchItems::anon_class_8_1_bc11688f::operator()(&checkLocalVar,pAVar7->left_);
          }
          else if (EVar1 == Call) {
            call = Expression::as<slang::ast::CallExpression>(this);
            AssertionExpr::checkAssertionCall
                      (call,context,(DiagCode)0x430008,(DiagCode)0x420008,
                       (optional<slang::DiagCode>)0x0,this->sourceRange);
          }
          else {
            ASTContext::addDiag(context,(DiagCode)0x200008,this->sourceRange);
          }
        }
      }
    }
    bVar3 = AssertionExpr::admitsEmpty(sequence);
    if (bVar3) {
      SVar10 = slang::syntax::SyntaxNode::sourceRange
                         (&(syntax->items).super_SyntaxListBase.super_SyntaxNode);
      this_01 = ASTContext::addDiag(context,(DiagCode)0x260008,SVar10);
      if (sequence->syntax != (SyntaxNode *)0x0) {
        SVar10 = slang::syntax::SyntaxNode::sourceRange(sequence->syntax);
        Diagnostic::operator<<(this_01,SVar10);
      }
    }
    dst = ASTContext::getCompilation(context);
    iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      (&results.super_SmallVectorBase<const_slang::ast::Expression_*>,
                       (EVP_PKEY_CTX *)dst,src);
    ppEVar8 = (pointer)CONCAT44(extraout_var_00,iVar4);
    SmallVectorBase<const_slang::ast::Expression_*>::~SmallVectorBase
              (&results.super_SmallVectorBase<const_slang::ast::Expression_*>);
    sVar9 = extraout_RDX;
  }
  else {
    results.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
    sVar9 = (syntax->items).elements.size_;
    results.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)&syntax->items;
    for (; ((SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *)
            results.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ != &syntax->items ||
           (results.super_SmallVectorBase<const_slang::ast::Expression_*>.len != sVar9 + 1 >> 1));
        results.super_SmallVectorBase<const_slang::ast::Expression_*>.len =
             results.super_SmallVectorBase<const_slang::ast::Expression_*>.len + 1) {
      this_00 = (AssertionExpr *)
                slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::
                iterator_base<const_slang::syntax::PropertyExprSyntax_*>::operator*
                          ((iterator_base<const_slang::syntax::PropertyExprSyntax_*> *)&results);
      AssertionExpr::bind(this_00,(int)&ctx,(sockaddr *)0x0,0);
    }
    sVar9 = 0;
    ppEVar8 = (pointer)0x0;
  }
  sVar11.size_ = sVar9;
  sVar11.data_ = ppEVar8;
  return sVar11;
}

Assistant:

static span<const Expression* const> bindMatchItems(const SequenceMatchListSyntax& syntax,
                                                    const ASTContext& context,
                                                    const AssertionExpr& sequence) {
    auto checkLocalVar = [&](const Expression& expr) {
        auto sym = expr.getSymbolReference();
        if (!sym || sym->kind != SymbolKind::LocalAssertionVar)
            context.addDiag(diag::LocalVarMatchItem, expr.sourceRange);
    };

    ASTContext ctx = context;
    ctx.flags &= ~ASTFlags::AssignmentDisallowed;

    // If we are creating an argument, these "match items" might actually be part of
    // a comma-separated event expression. We need to avoid erroring in that case.
    // Just do the bare minimum to check the expressions here.
    if (ctx.flags.has(ASTFlags::AssertionInstanceArgCheck)) {
        for (auto item : syntax.items)
            AssertionExpr::bind(*item, ctx);
        return {};
    }

    SmallVector<const Expression*> results;
    for (auto item : syntax.items) {
        auto exprSyn = context.requireSimpleExpr(*item, diag::InvalidMatchItem);
        if (!exprSyn)
            continue;

        auto& expr = Expression::bind(*exprSyn, ctx, ASTFlags::AssignmentAllowed);
        results.push_back(&expr);

        switch (expr.kind) {
            case ExpressionKind::Assignment: {
                auto& assign = expr.as<AssignmentExpression>();
                checkLocalVar(assign.left());
                break;
            }
            case ExpressionKind::UnaryOp: {
                auto& unary = expr.as<UnaryExpression>();
                switch (unary.op) {
                    case UnaryOperator::Preincrement:
                    case UnaryOperator::Predecrement:
                    case UnaryOperator::Postincrement:
                    case UnaryOperator::Postdecrement:
                        checkLocalVar(unary.operand());
                        break;
                    default:
                        context.addDiag(diag::InvalidMatchItem, expr.sourceRange);
                        break;
                }
                break;
            }
            case ExpressionKind::Call: {
                AssertionExpr::checkAssertionCall(expr.as<CallExpression>(), context,
                                                  diag::SubroutineMatchOutArg,
                                                  diag::SubroutineMatchAutoRefArg, std::nullopt,
                                                  expr.sourceRange);
                break;
            }
            case ExpressionKind::Invalid:
                break;
            default:
                context.addDiag(diag::InvalidMatchItem, expr.sourceRange);
                break;
        }
    }

    if (sequence.admitsEmpty()) {
        auto& diag = context.addDiag(diag::MatchItemsAdmitEmpty, syntax.items.sourceRange());
        if (sequence.syntax)
            diag << sequence.syntax->sourceRange();
    }

    return results.copy(context.getCompilation());
}